

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O0

void __thiscall QExpandingLineEdit::resizeToContents(QExpandingLineEdit *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QWidget *pQVar7;
  int *piVar8;
  long in_RDI;
  long in_FS_OFFSET;
  int newWidth;
  int parentWidth;
  QWidget *parent;
  int oldWidth;
  int maxWidth;
  int hintWidth;
  QPoint position;
  QWidget *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int local_3c;
  undefined1 local_38 [24];
  QFontMetrics local_20 [12];
  int local_14;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QWidget::width((QWidget *)0x858210);
  if (*(int *)(in_RDI + 0x28) == -1) {
    *(int *)(in_RDI + 0x28) = iVar2;
  }
  pQVar7 = QWidget::parentWidget((QWidget *)0x858237);
  if (pQVar7 != (QWidget *)0x0) {
    local_10 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QWidget::pos((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                           );
    iVar3 = QWidget::minimumWidth
                      ((QWidget *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    QWidget::fontMetrics(in_stack_ffffffffffffff78);
    QLineEdit::displayText
              ((QLineEdit *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    iVar4 = QFontMetrics::horizontalAdvance((QString *)local_20,(int)local_38);
    iVar4 = iVar3 + iVar4;
    QString::~QString((QString *)0x8582b9);
    QFontMetrics::~QFontMetrics(local_20);
    local_14 = iVar4;
    iVar5 = QWidget::width((QWidget *)0x8582d5);
    bVar1 = QWidget::isRightToLeft((QWidget *)0x8582e3);
    if (bVar1) {
      iVar6 = QPoint::x((QPoint *)0x8582f3);
      iVar6 = iVar6 + iVar2;
    }
    else {
      iVar2 = iVar5;
      iVar6 = QPoint::x((QPoint *)0x85830f);
      iVar6 = iVar5 - iVar6;
      in_stack_ffffffffffffff88 = iVar5;
      iVar5 = iVar2;
    }
    local_3c = iVar6;
    qMin<int>((int *)(in_RDI + 0x28),&local_3c);
    piVar8 = qBound<int>((int *)CONCAT44(iVar4,iVar3),
                         (int *)CONCAT44(iVar6,in_stack_ffffffffffffff88),
                         (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    if ((*(byte *)(in_RDI + 0x2c) & 1) != 0) {
      QWidget::setMaximumWidth((QWidget *)CONCAT44(iVar5,*piVar8),(int)((ulong)in_RDI >> 0x20));
    }
    bVar1 = QWidget::isRightToLeft((QWidget *)0x858374);
    if (bVar1) {
      QPoint::x((QPoint *)0x858384);
      QPoint::y((QPoint *)0x85839a);
      QWidget::move((QWidget *)CONCAT44(iVar4,iVar3),iVar6,in_stack_ffffffffffffff88);
    }
    QWidget::height((QWidget *)0x8583bc);
    QWidget::resize((QWidget *)CONCAT44(iVar4,iVar3),iVar6,in_stack_ffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QExpandingLineEdit::resizeToContents()
{
    int oldWidth = width();
    if (originalWidth == -1)
        originalWidth = oldWidth;
    if (QWidget *parent = parentWidget()) {
        QPoint position = pos();
        int hintWidth = minimumWidth() + fontMetrics().horizontalAdvance(displayText());
        int parentWidth = parent->width();
        int maxWidth = isRightToLeft() ? position.x() + oldWidth : parentWidth - position.x();
        int newWidth = qBound(qMin(originalWidth, maxWidth), hintWidth, maxWidth);
        if (widgetOwnsGeometry)
            setMaximumWidth(newWidth);
        if (isRightToLeft())
            move(position.x() - newWidth + oldWidth, position.y());
        resize(newWidth, height());
    }
}